

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O3

int ARKStepSetUserData(void *arkode_mem,void *user_data)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetUserData",&local_18,&local_20);
  if ((((iVar1 == 0) && (iVar1 = arkSetUserData(arkode_mem,user_data), iVar1 == 0)) &&
      ((local_20->lmem == (void *)0x0 ||
       (iVar1 = arkLSSetUserData(arkode_mem,user_data), iVar1 == 0)))) &&
     ((local_20->mass_mem == (void *)0x0 ||
      (iVar1 = arkLSSetMassUserData(arkode_mem,user_data), iVar1 == 0)))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKStepSetUserData(void *arkode_mem, void *user_data)
{
  ARKodeMem        ark_mem;
  ARKodeARKStepMem step_mem;
  int              retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetUserData",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* set user_data in ARKode mem */
  retval = arkSetUserData(arkode_mem, user_data);
  if (retval != ARK_SUCCESS) return(retval);

  /* set user data in ARKodeLS mem */
  if (step_mem->lmem != NULL) {
    retval = arkLSSetUserData(arkode_mem, user_data);
    if (retval != ARKLS_SUCCESS) return(retval);
  }

  /* set user data in ARKodeLSMass mem */
  if (step_mem->mass_mem != NULL) {
    retval = arkLSSetMassUserData(arkode_mem, user_data);
    if (retval != ARKLS_SUCCESS) return(retval);
  }

  return(ARK_SUCCESS);
}